

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * sqlite3SrcListAppend(Parse *pParse,SrcList *pList,Token *pTable,Token *pDatabase)

{
  int iVar1;
  sqlite3 *db;
  SrcList *pSVar2;
  char *pcVar3;
  
  db = pParse->db;
  if (pList == (SrcList *)0x0) {
    pSVar2 = (SrcList *)sqlite3DbMallocRawNN(db,0x70);
    if (pSVar2 == (SrcList *)0x0) {
      return (SrcList *)0x0;
    }
    pSVar2->nSrc = 1;
    pSVar2->nAlloc = 1;
    *(undefined8 *)&pSVar2->a[0].iCursor = 0;
    pSVar2->a[0].u3.pOn = (Expr *)0x0;
    pSVar2->a[0].pSchema = (Schema *)0x0;
    pSVar2->a[0].zDatabase = (char *)0x0;
    pSVar2->a[0].zName = (char *)0x0;
    pSVar2->a[0].zAlias = (char *)0x0;
    pSVar2->a[0].pTab = (Table *)0x0;
    pSVar2->a[0].pSelect = (Select *)0x0;
    pSVar2->a[0].addrFillSub = 0;
    pSVar2->a[0].regReturn = 0;
    pSVar2->a[0].regResult = 0;
    pSVar2->a[0].fg = (anon_struct_4_16_b3272645_for_fg)0x0;
    pSVar2->a[0].colUsed = 0;
    pSVar2->a[0].u1.zIndexedBy = (char *)0x0;
    pSVar2->a[0].u2.pIBIndex = (Index *)0x0;
    pSVar2->a[0].iCursor = -1;
  }
  else {
    pSVar2 = sqlite3SrcListEnlarge(pParse,pList,1,pList->nSrc);
    if (pSVar2 == (SrcList *)0x0) {
      sqlite3SrcListDelete(db,pList);
      return (SrcList *)0x0;
    }
  }
  iVar1 = pSVar2->nSrc;
  if (pDatabase == (Token *)0x0) {
    pDatabase = (Token *)0x0;
  }
  else if (pDatabase->z == (char *)0x0) {
    pDatabase = (Token *)0x0;
  }
  if (pDatabase == (Token *)0x0) {
    pcVar3 = sqlite3NameFromToken(db,pTable);
    pSVar2->a[(long)iVar1 + -1].zName = pcVar3;
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = sqlite3NameFromToken(db,pDatabase);
    pSVar2->a[(long)iVar1 + -1].zName = pcVar3;
    pcVar3 = sqlite3NameFromToken(db,pTable);
  }
  pSVar2->a[(long)iVar1 + -1].zDatabase = pcVar3;
  return pSVar2;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppend(
  Parse *pParse,      /* Parsing context, in which errors are reported */
  SrcList *pList,     /* Append to this SrcList. NULL creates a new SrcList */
  Token *pTable,      /* Table to append */
  Token *pDatabase    /* Database of the table */
){
  SrcItem *pItem;
  sqlite3 *db;
  assert( pDatabase==0 || pTable!=0 );  /* Cannot have C without B */
  assert( pParse!=0 );
  assert( pParse->db!=0 );
  db = pParse->db;
  if( pList==0 ){
    pList = sqlite3DbMallocRawNN(pParse->db, sizeof(SrcList) );
    if( pList==0 ) return 0;
    pList->nAlloc = 1;
    pList->nSrc = 1;
    memset(&pList->a[0], 0, sizeof(pList->a[0]));
    pList->a[0].iCursor = -1;
  }else{
    SrcList *pNew = sqlite3SrcListEnlarge(pParse, pList, 1, pList->nSrc);
    if( pNew==0 ){
      sqlite3SrcListDelete(db, pList);
      return 0;
    }else{
      pList = pNew;
    }
  }
  pItem = &pList->a[pList->nSrc-1];
  if( pDatabase && pDatabase->z==0 ){
    pDatabase = 0;
  }
  if( pDatabase ){
    pItem->zName = sqlite3NameFromToken(db, pDatabase);
    pItem->zDatabase = sqlite3NameFromToken(db, pTable);
  }else{
    pItem->zName = sqlite3NameFromToken(db, pTable);
    pItem->zDatabase = 0;
  }
  return pList;
}